

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O0

int32_t mtmd_helper_bitmap_init_from_file(char *fname,mtmd_bitmap *output)

{
  undefined1 uVar1;
  uchar *__dest;
  int *in_RSI;
  clip_image_u8 *in_RDI;
  uchar *data;
  bool ok;
  clip_image_u8_ptr img_u8;
  pointer in_stack_ffffffffffffff98;
  clip_image_u8 *in_stack_ffffffffffffffa0;
  clip_image_u8 *pcVar2;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int32_t local_4;
  
  clip_image_u8_init();
  std::unique_ptr<clip_image_u8,clip_image_u8_deleter>::unique_ptr<clip_image_u8_deleter,void>
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  pcVar2 = in_RDI;
  std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::get
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffffa0);
  uVar1 = clip_image_load_from_file
                    ((char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),pcVar2);
  if ((bool)uVar1) {
    std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::get
              ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 =
         (clip_image_u8 *)
         clip_image_u8_get_data
                   (in_stack_ffffffffffffffa0,(uint32_t *)in_stack_ffffffffffffff98,
                    (uint32_t *)0x19b5ef);
    pcVar2 = in_stack_ffffffffffffffa0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffa0,
               CONCAT17(uVar1,in_stack_ffffffffffffffb8));
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19b630);
    memcpy(__dest,pcVar2,(ulong)(uint)(*in_RSI * in_RSI[1] * 3));
    local_4 = 0;
  }
  else {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"Unable to load image %s\n",in_RDI);
    }
    local_4 = 1;
  }
  std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::~unique_ptr
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)in_stack_ffffffffffffffa0);
  return local_4;
}

Assistant:

int32_t mtmd_helper_bitmap_init_from_file(const char * fname, mtmd_bitmap & output) {
    clip_image_u8_ptr img_u8(clip_image_u8_init());
    bool ok = clip_image_load_from_file(fname, img_u8.get());
    if (!ok) {
        LOG_ERR("Unable to load image %s\n", fname);
        return 1;
    }
    unsigned char * data = clip_image_u8_get_data(img_u8.get(), &output.nx, &output.ny);
    output.data.resize(output.nx * output.ny * 3);
    std::memcpy(output.data.data(), data, output.nx * output.ny * 3);
    return 0;
}